

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  int depth;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  stbi_uc sVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  stbi_uc **ppsVar14;
  char *pcVar15;
  stbi_uc *psVar16;
  size_t sVar17;
  byte *pbVar18;
  int *piVar19;
  bool bVar20;
  ulong uVar21;
  stbi_uc *psVar22;
  uint uVar23;
  long lVar24;
  uint color;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  stbi_uc *psVar30;
  stbi__uint32 raw_len_00;
  int iVar31;
  size_t __size;
  long *in_FS_OFFSET;
  int local_514;
  stbi_uc tc [3];
  ulong local_4d0;
  stbi__uint32 raw_len;
  ulong local_4a8;
  stbi_uc *local_4a0;
  stbi_uc *local_498;
  ulong local_490;
  stbi_uc *local_488;
  stbi__context *local_480;
  size_t local_478;
  int local_470;
  int local_46c;
  ulong local_468;
  long local_460;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    local_514 = 0;
  }
  else {
    local_514 = 1;
    if (scan != 1) {
      ppsVar14 = &z->idata;
      bVar3 = true;
      local_468 = 0;
      color = 0;
      bVar4 = false;
      local_4d0 = 0;
      __size = 0;
      local_4a8 = 0;
      bVar5 = false;
      bVar6 = 0;
      do {
        iVar9 = stbi__get16be(s);
        uVar10 = stbi__get16be(s);
        uVar13 = iVar9 * 0x10000 + uVar10;
        uVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar23 = uVar11 << 0x10 | uVar12;
        uVar26 = (uint)local_4d0;
        if ((int)uVar23 < 0x49484452) {
          if (uVar23 == 0x43674249) {
            bVar4 = true;
LAB_00142d51:
            stbi__skip(s,uVar13);
LAB_00143003:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar2 = true;
          }
          else {
            iVar9 = (int)local_4a8;
            if (uVar23 == 0x49444154) {
              if (bVar3) {
LAB_00142e2c:
                in_FS_OFFSET[-6] = (long)"first not IHDR";
                bVar3 = true;
                goto LAB_00142e46;
              }
              if ((bVar6 != 0) && (uVar26 == 0)) {
                in_FS_OFFSET[-6] = (long)"no PLTE";
                bVar3 = false;
                local_4d0 = 0;
                goto LAB_00142e46;
              }
              if (scan == 2) {
                s->img_n = (uint)bVar6;
                local_514 = 1;
                bVar3 = false;
                goto LAB_00143aa2;
              }
              uVar10 = uVar13 + iVar9;
              if (iVar9 <= (int)uVar10) {
                if ((uint)__size < uVar10) {
                  sVar17 = 0x1000;
                  if (0x1000 < uVar13) {
                    sVar17 = (ulong)uVar13;
                  }
                  if ((uint)__size != 0) {
                    sVar17 = __size;
                  }
                  do {
                    __size = sVar17;
                    sVar17 = (ulong)((uint)__size * 2);
                  } while ((uint)__size < uVar10);
                  psVar16 = (stbi_uc *)realloc(*ppsVar14,__size);
                  if (psVar16 == (stbi_uc *)0x0) {
                    in_FS_OFFSET[-6] = (long)"outofmem";
                    goto LAB_001438a8;
                  }
                  *ppsVar14 = psVar16;
                }
                iVar9 = stbi__getn(s,*ppsVar14 + (local_4a8 & 0xffffffff),uVar13);
                bVar3 = false;
                if (iVar9 != 0) {
                  local_4a8 = (ulong)uVar10;
                  goto LAB_00143003;
                }
                in_FS_OFFSET[-6] = (long)"outofdata";
              }
LAB_001438a8:
              bVar3 = false;
              local_514 = 0;
              bVar2 = false;
            }
            else {
              if (uVar23 != 0x49454e44) {
LAB_00142d8b:
                if (bVar3) goto LAB_00142e2c;
                bVar3 = false;
                if ((uVar11 >> 0xd & 1) == 0) {
                  stbi__parse_png_file::invalid_chunk[0] = (char)(uVar23 >> 0x18);
                  stbi__parse_png_file::invalid_chunk[1] = (char)(uVar23 >> 0x10);
                  stbi__parse_png_file::invalid_chunk[2] = (char)(uVar12 >> 8);
                  stbi__parse_png_file::invalid_chunk[3] = (char)uVar12;
                  pcVar15 = stbi__parse_png_file::invalid_chunk;
                  goto LAB_00143021;
                }
                goto LAB_00142d51;
              }
              if (bVar3) {
                pcVar15 = "first not IHDR";
LAB_00142c92:
                in_FS_OFFSET[-6] = (long)pcVar15;
                local_514 = 0;
              }
              else if (scan == 0) {
                if (*ppsVar14 == (stbi_uc *)0x0) {
                  pcVar15 = "no IDAT";
                  goto LAB_00142c92;
                }
                raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
                psVar16 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*ppsVar14,iVar9,raw_len,(int *)&raw_len,(uint)!bVar4);
                z->expanded = psVar16;
                local_514 = 0;
                if (psVar16 != (stbi_uc *)0x0) {
                  free(*ppsVar14);
                  raw_len_00 = raw_len;
                  *ppsVar14 = (stbi_uc *)0x0;
                  iVar9 = s->img_n + 1;
                  if (bVar5 || (bVar6 == 0 && req_comp != 3) && iVar9 == req_comp) {
                    s->img_out_n = iVar9;
                  }
                  else {
                    s->img_out_n = s->img_n;
                  }
                  psVar16 = z->expanded;
                  iVar9 = s->img_out_n;
                  depth = z->depth;
                  iVar28 = iVar9 << (depth == 0x10);
                  x = z->s->img_x;
                  y = z->s->img_y;
                  if ((int)local_468 == 0) {
                    iVar9 = stbi__create_png_image_raw(z,psVar16,raw_len,iVar9,x,y,depth,color);
                    if (iVar9 != 0) goto LAB_001436af;
                  }
                  else {
                    local_4a0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar28,0);
                    if (local_4a0 != (stbi_uc *)0x0) {
                      local_478 = (size_t)iVar28;
                      lVar24 = 0;
                      local_470 = iVar28;
                      do {
                        psVar1 = z->s;
                        local_498 = (stbi_uc *)(long)(int)(&DAT_0029c180)[lVar24];
                        uVar13 = (&DAT_0029c1c0)[lVar24];
                        uVar26 = ~(&DAT_0029c180)[lVar24] + psVar1->img_x + uVar13;
                        uVar11 = uVar26 / uVar13;
                        uVar10 = (&DAT_0029c1e0)[lVar24];
                        local_480 = (stbi__context *)
                                    CONCAT44(local_480._4_4_,(&DAT_0029c1a0)[lVar24]);
                        uVar23 = ~(&DAT_0029c1a0)[lVar24] + psVar1->img_y + uVar10;
                        uVar12 = uVar23 / uVar10;
                        bVar20 = true;
                        if ((uVar13 <= uVar26) && (uVar10 <= uVar23)) {
                          local_46c = uVar11 * depth * psVar1->img_n;
                          local_488 = (stbi_uc *)(long)(int)uVar13;
                          local_460 = lVar24;
                          iVar28 = stbi__create_png_image_raw
                                             (z,psVar16,raw_len_00,iVar9,uVar11,uVar12,depth,color);
                          if (iVar28 == 0) {
                            free(local_4a0);
                            bVar20 = false;
                            lVar24 = local_460;
                          }
                          else {
                            if (0 < (int)uVar12) {
                              iVar31 = (int)local_480 * local_470;
                              iVar28 = uVar10 * local_470;
                              local_498 = local_4a0 + (long)local_498 * local_478;
                              lVar24 = (long)local_488 * local_478;
                              local_490 = 0;
                              sVar17 = local_478;
                              do {
                                if (0 < (int)uVar11) {
                                  local_480 = z->s;
                                  local_488 = z->out;
                                  lVar29 = local_490 * (long)(int)uVar11;
                                  lVar25 = 0;
                                  psVar30 = local_498;
                                  do {
                                    memcpy(psVar30 + local_480->img_x * iVar31,
                                           local_488 + (lVar29 + lVar25) * sVar17,local_478);
                                    lVar25 = lVar25 + 1;
                                    psVar30 = psVar30 + lVar24;
                                    sVar17 = local_478;
                                  } while (lVar25 < (int)uVar11);
                                }
                                local_490 = local_490 + 1;
                                iVar31 = iVar31 + iVar28;
                              } while (local_490 < uVar12);
                            }
                            uVar12 = ((local_46c + 7 >> 3) + 1) * uVar12;
                            free(z->out);
                            psVar16 = psVar16 + uVar12;
                            raw_len_00 = raw_len_00 - uVar12;
                            bVar20 = true;
                            lVar24 = local_460;
                          }
                        }
                        if (!bVar20) goto LAB_00143aa2;
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 7);
                      z->out = local_4a0;
LAB_001436af:
                      if (bVar5) {
                        if (z->depth == 0x10) {
                          stbi__compute_transparency16(z,tc16,s->img_out_n);
                        }
                        else {
                          stbi__compute_transparency(z,tc,s->img_out_n);
                        }
                      }
                      if (bVar4) {
                        piVar19 = (int *)(*in_FS_OFFSET + -0x18);
                        if (*(int *)((long)in_FS_OFFSET + -0x14) == 0) {
                          piVar19 = &stbi__de_iphone_flag_global;
                        }
                        if ((*piVar19 != 0) && (2 < s->img_out_n)) {
                          stbi__de_iphone(z);
                        }
                      }
                      if (bVar6 == 0) {
                        if (bVar5) {
                          s->img_n = s->img_n + 1;
                        }
                      }
                      else {
                        s->img_n = (uint)bVar6;
                        uVar13 = (uint)bVar6;
                        if (2 < req_comp) {
                          uVar13 = req_comp;
                        }
                        s->img_out_n = uVar13;
                        psVar16 = z->out;
                        uVar10 = z->s->img_y * z->s->img_x;
                        psVar30 = (stbi_uc *)stbi__malloc_mad2(uVar10,uVar13,0);
                        if (psVar30 == (stbi_uc *)0x0) {
                          in_FS_OFFSET[-6] = (long)"outofmem";
                        }
                        else {
                          if (uVar13 == 3) {
                            if (uVar10 != 0) {
                              uVar21 = 0;
                              psVar22 = psVar30;
                              do {
                                uVar27 = (ulong)psVar16[uVar21];
                                *psVar22 = palette[uVar27 * 4];
                                psVar22[1] = palette[uVar27 * 4 + 1];
                                psVar22[2] = palette[uVar27 * 4 + 2];
                                psVar22 = psVar22 + 3;
                                uVar21 = uVar21 + 1;
                              } while (uVar10 != uVar21);
                            }
                          }
                          else if (uVar10 != 0) {
                            uVar21 = 0;
                            do {
                              *(undefined4 *)(psVar30 + uVar21 * 4) =
                                   *(undefined4 *)(palette + (ulong)psVar16[uVar21] * 4);
                              uVar21 = uVar21 + 1;
                            } while (uVar10 != uVar21);
                          }
                          free(psVar16);
                          z->out = psVar30;
                        }
                        if (psVar30 == (stbi_uc *)0x0) goto LAB_00143aa2;
                      }
                      free(z->expanded);
                      z->expanded = (stbi_uc *)0x0;
                      stbi__get16be(s);
                      stbi__get16be(s);
                      goto LAB_00142e9e;
                    }
                    in_FS_OFFSET[-6] = (long)"outofmem";
                  }
                }
              }
              else {
LAB_00142e9e:
                local_514 = 1;
              }
LAB_00143aa2:
              bVar2 = false;
            }
          }
        }
        else if (uVar23 == 0x74524e53) {
          if (bVar3) {
            in_FS_OFFSET[-6] = (long)"first not IHDR";
            bVar3 = true;
LAB_00142e7c:
            local_514 = 0;
          }
          else {
            if (*ppsVar14 != (stbi_uc *)0x0) {
              pcVar15 = "tRNS after IDAT";
LAB_00142e69:
              in_FS_OFFSET[-6] = (long)pcVar15;
              bVar3 = false;
              goto LAB_00142e7c;
            }
            if (bVar6 == 0) {
              if ((s->img_n & 1U) == 0) {
                pcVar15 = "tRNS with alpha";
              }
              else {
                if (s->img_n * 2 == uVar13) {
                  bVar5 = true;
                  if (z->depth == 0x10) {
                    if (0 < s->img_n) {
                      lVar24 = 0;
                      do {
                        iVar9 = stbi__get16be(s);
                        tc16[lVar24] = (stbi__uint16)iVar9;
                        lVar24 = lVar24 + 1;
                      } while (lVar24 < s->img_n);
                      bVar3 = false;
                      bVar6 = 0;
                      goto LAB_00143003;
                    }
                  }
                  else if (0 < s->img_n) {
                    lVar24 = 0;
                    do {
                      iVar9 = stbi__get16be(s);
                      tc[lVar24] = ""[z->depth] * (char)iVar9;
                      lVar24 = lVar24 + 1;
                    } while (lVar24 < s->img_n);
                  }
                  bVar8 = 0;
LAB_00143a32:
                  bVar6 = bVar8;
                  bVar3 = false;
                  goto LAB_00143003;
                }
                pcVar15 = "bad tRNS len";
              }
              in_FS_OFFSET[-6] = (long)pcVar15;
              bVar3 = false;
              bVar6 = 0;
              local_514 = 0;
            }
            else {
              if (scan != 2) {
                if (uVar26 == 0) {
                  in_FS_OFFSET[-6] = (long)"tRNS before PLTE";
                  bVar3 = false;
                  local_4d0 = 0;
                  goto LAB_00142e7c;
                }
                if (uVar13 <= uVar26) {
                  bVar6 = 4;
                  bVar3 = false;
                  bVar8 = 4;
                  if (uVar13 == 0) goto LAB_00143a32;
                  uVar21 = 0;
                  do {
                    psVar16 = s->img_buffer;
                    if (psVar16 < s->img_buffer_end) {
LAB_001437b7:
                      s->img_buffer = psVar16 + 1;
                      sVar7 = *psVar16;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar16 = s->img_buffer;
                        goto LAB_001437b7;
                      }
                      sVar7 = '\0';
                    }
                    palette[uVar21 * 4 + 3] = sVar7;
                    uVar21 = uVar21 + 1;
                  } while (uVar10 + iVar9 * 0x10000 != uVar21);
                  goto LAB_00143003;
                }
                pcVar15 = "bad tRNS len";
                goto LAB_00142e69;
              }
              s->img_n = 4;
              local_514 = 1;
              bVar3 = false;
            }
          }
          bVar2 = false;
        }
        else {
          if (uVar23 == 0x504c5445) {
            if (bVar3) goto LAB_00142e2c;
            if ((uVar13 < 0x301) &&
               (local_4d0 = (ulong)uVar10 * 0x55555556 >> 0x20,
               (int)((ulong)uVar10 * 0x55555556 >> 0x20) * 3 == uVar13)) {
              bVar3 = false;
              if (2 < uVar10) {
                uVar21 = 0;
                do {
                  psVar16 = s->img_buffer;
                  if (psVar16 < s->img_buffer_end) {
LAB_00142f25:
                    s->img_buffer = psVar16 + 1;
                    sVar7 = *psVar16;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar16 = s->img_buffer;
                      goto LAB_00142f25;
                    }
                    sVar7 = '\0';
                  }
                  palette[uVar21 * 4] = sVar7;
                  psVar16 = s->img_buffer;
                  if (psVar16 < s->img_buffer_end) {
LAB_00142f5f:
                    s->img_buffer = psVar16 + 1;
                    sVar7 = *psVar16;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar16 = s->img_buffer;
                      goto LAB_00142f5f;
                    }
                    sVar7 = '\0';
                  }
                  palette[uVar21 * 4 + 1] = sVar7;
                  psVar16 = s->img_buffer;
                  if (psVar16 < s->img_buffer_end) {
LAB_00142f99:
                    s->img_buffer = psVar16 + 1;
                    sVar7 = *psVar16;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar16 = s->img_buffer;
                      goto LAB_00142f99;
                    }
                    sVar7 = '\0';
                  }
                  palette[uVar21 * 4 + 2] = sVar7;
                  palette[uVar21 * 4 + 3] = 0xff;
                  uVar21 = uVar21 + 1;
                } while (local_4d0 != uVar21);
              }
              goto LAB_00143003;
            }
            pcVar15 = "invalid PLTE";
LAB_00143021:
            in_FS_OFFSET[-6] = (long)pcVar15;
            bVar3 = false;
LAB_00142e46:
            bVar2 = false;
            local_514 = 0;
            goto LAB_00143aa4;
          }
          if (uVar23 != 0x49484452) goto LAB_00142d8b;
          if (bVar3) {
            if (uVar13 != 0xd) {
              pcVar15 = "bad IHDR len";
              goto LAB_00142fdb;
            }
            iVar9 = stbi__get16be(s);
            uVar13 = stbi__get16be(s);
            s->img_x = uVar13 | iVar9 << 0x10;
            iVar9 = stbi__get16be(s);
            uVar13 = stbi__get16be(s);
            uVar13 = uVar13 | iVar9 << 0x10;
            s->img_y = uVar13;
            if ((0x1000000 < uVar13) || (0x1000000 < s->img_x)) {
              pcVar15 = "too large";
              goto LAB_00142fdb;
            }
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_001431e5:
              s->img_buffer = pbVar18 + 1;
              bVar8 = *pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar18 = s->img_buffer;
                goto LAB_001431e5;
              }
              bVar8 = 0;
            }
            z->depth = (uint)bVar8;
            if ((0x10 < bVar8) || ((0x10116U >> (bVar8 & 0x1f) & 1) == 0)) {
              pcVar15 = "1/2/4/8/16-bit only";
              goto LAB_00142fdb;
            }
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_0014323c:
              s->img_buffer = pbVar18 + 1;
              color = (uint)*pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar18 = s->img_buffer;
                goto LAB_0014323c;
              }
              color = 0;
            }
            if ((byte)color < 7) {
              if (color != 3) {
                bVar8 = bVar6;
                if ((color & 1) == 0) goto LAB_00143716;
                goto LAB_00143257;
              }
              bVar8 = 3;
              if (z->depth == 0x10) {
                in_FS_OFFSET[-6] = (long)"bad ctype";
                color = 3;
                goto LAB_00143269;
              }
LAB_00143716:
              bVar6 = bVar8;
              psVar16 = s->img_buffer;
              if (psVar16 < s->img_buffer_end) {
LAB_00143745:
                s->img_buffer = psVar16 + 1;
                if (*psVar16 == '\0') goto LAB_001438be;
                pcVar15 = "bad comp method";
LAB_00143b28:
                in_FS_OFFSET[-6] = (long)pcVar15;
                bVar20 = false;
                local_514 = 0;
                goto LAB_00142fee;
              }
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar16 = s->img_buffer;
                goto LAB_00143745;
              }
LAB_001438be:
              sVar7 = stbi__get8(s);
              if (sVar7 != '\0') {
                pcVar15 = "bad filter method";
                goto LAB_00143b28;
              }
              bVar8 = stbi__get8(s);
              local_468 = (ulong)bVar8;
              if (1 < bVar8) {
                pcVar15 = "bad interlace method";
                goto LAB_00143b28;
              }
              uVar13 = s->img_x;
              if ((uVar13 == 0) || (uVar10 = s->img_y, uVar10 == 0)) {
                pcVar15 = "0-pixel image";
                goto LAB_00143b28;
              }
              if (bVar6 == 0) {
                uVar11 = (3 < (byte)color) + 1 + (color & 2);
                s->img_n = uVar11;
                if ((uint)((0x40000000 / (ulong)uVar13) / (ulong)uVar11) < uVar10) {
                  in_FS_OFFSET[-6] = (long)"too large";
                  bVar6 = 0;
                  goto LAB_00142fe6;
                }
                if (scan != 2) goto LAB_00143bb4;
                local_514 = 1;
                bVar20 = false;
                bVar6 = 0;
                goto LAB_00142fee;
              }
              s->img_n = 1;
              if (uVar10 <= (uint)(0x40000000 / (ulong)uVar13 >> 2)) {
LAB_00143bb4:
                bVar20 = true;
                goto LAB_00142fee;
              }
              in_FS_OFFSET[-6] = (long)"too large";
              goto LAB_00142fe6;
            }
LAB_00143257:
            in_FS_OFFSET[-6] = (long)"bad ctype";
LAB_00143269:
            bVar20 = false;
            local_514 = 0;
          }
          else {
            pcVar15 = "multiple IHDR";
LAB_00142fdb:
            in_FS_OFFSET[-6] = (long)pcVar15;
LAB_00142fe6:
            bVar20 = false;
            local_514 = 0;
          }
LAB_00142fee:
          bVar3 = false;
          bVar2 = false;
          if (bVar20) goto LAB_00143003;
        }
LAB_00143aa4:
      } while (bVar2);
    }
  }
  return local_514;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}